

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void nn_hash_rehash(nn_hash *self)

{
  uint uVar1;
  nn_list *__ptr;
  uint uVar2;
  nn_list *pnVar3;
  ulong uVar4;
  nn_list_item *item;
  
  uVar1 = self->slots;
  __ptr = self->array;
  self->slots = uVar1 * 2;
  pnVar3 = (nn_list *)malloc((ulong)(uVar1 * 2) << 4);
  self->array = pnVar3;
  if (pnVar3 != (nn_list *)0x0) {
    if (self->slots != 0) {
      uVar2 = 0;
      do {
        pnVar3 = self->array;
        pnVar3[uVar2].first = (nn_list_item *)0x0;
        pnVar3[uVar2].last = (nn_list_item *)0x0;
        uVar2 = uVar2 + 1;
      } while (uVar2 != self->slots);
    }
    if ((ulong)uVar1 != 0) {
      uVar4 = 0;
      do {
        pnVar3 = __ptr + uVar4;
        item = __ptr[uVar4].first;
        while (item != (nn_list_item *)0x0) {
          nn_list_erase(pnVar3,item);
          uVar2 = (*(uint *)&item[-1].prev >> 0x10 ^ *(uint *)&item[-1].prev ^ 0x3d) * 9;
          uVar2 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d;
          nn_list_insert(self->array + (ulong)(uVar2 >> 0xf ^ uVar2) % (ulong)self->slots,item,
                         (nn_list_item *)0x0);
          item = pnVar3->first;
        }
        nn_list_term(pnVar3);
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar1);
    }
    free(__ptr);
    return;
  }
  nn_hash_rehash_cold_1();
}

Assistant:

static void nn_hash_rehash (struct nn_hash *self) {
    uint32_t i;
    uint32_t oldslots;
    struct nn_list *oldarray;
    struct nn_hash_item *hitm;
    uint32_t newslot;

    /*  Allocate new double-sized array of slots. */
    oldslots = self->slots;
    oldarray = self->array;
    self->slots *= 2;
    self->array = nn_alloc (sizeof (struct nn_list) * self->slots, "hash map");
    alloc_assert (self->array);
    for (i = 0; i != self->slots; ++i)
    nn_list_init (&self->array [i]);

    /*  Move the items from old slot array to new slot array. */
    for (i = 0; i != oldslots; ++i) {
    while (!nn_list_empty (&oldarray [i])) {
        hitm = nn_cont (nn_list_begin (&oldarray [i]),
                struct nn_hash_item, list);
        nn_list_erase (&oldarray [i], &hitm->list);
        newslot = nn_hash_key (hitm->key) % self->slots;
        nn_list_insert (&self->array [newslot], &hitm->list,
                nn_list_end (&self->array [newslot]));
    }

    nn_list_term (&oldarray [i]);
    }

    /*  Deallocate the old array of slots. */
    nn_free (oldarray);
}